

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

dtime_t duckdb::Time::NormalizeTimeTZ(dtime_tz_t timetz)

{
  dtime_t dVar1;
  long lVar2;
  
  dVar1.micros = (long)((ulong)((uint)timetz.bits & 0xffffff) * 1000000 + -0xd692afdc0) %
                 86400000000 + (timetz.bits >> 0x18);
  if (dVar1.micros < 86400000000) {
    if (-1 < dVar1.micros) {
      return (dtime_t)dVar1.micros;
    }
    lVar2 = 86400000000;
  }
  else {
    lVar2 = -86400000000;
  }
  return (dtime_t)(dVar1.micros + lVar2);
}

Assistant:

dtime_t Time::NormalizeTimeTZ(dtime_tz_t timetz) {
	date_t date(0);
	return Interval::Add(timetz.time(), {0, 0, -timetz.offset() * Interval::MICROS_PER_SEC}, date);
}